

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

LIBSSH2_SFTP_HANDLE *
sftp_open(LIBSSH2_SFTP *sftp,char *filename,size_t filename_len,uint32_t flags,long mode,
         int open_type,LIBSSH2_SFTP_ATTRIBUTES *attrs_in)

{
  LIBSSH2_CHANNEL *channel_00;
  LIBSSH2_SESSION *session_00;
  undefined1 uVar1;
  int iVar2;
  uint32_t uVar3;
  ssize_t sVar4;
  bool bVar5;
  int local_cc;
  uchar *puStack_b8;
  int badness;
  uchar *data;
  size_t data_len;
  long lStack_a0;
  int open_file;
  ssize_t rc;
  uchar *s;
  LIBSSH2_SFTP_ATTRIBUTES attrs;
  LIBSSH2_SFTP_HANDLE *fp;
  LIBSSH2_SESSION *session;
  LIBSSH2_CHANNEL *channel;
  int open_type_local;
  long mode_local;
  uint32_t flags_local;
  size_t filename_len_local;
  char *filename_local;
  LIBSSH2_SFTP *sftp_local;
  
  channel_00 = sftp->channel;
  session_00 = channel_00->session;
  memset(&s,0,0x38);
  s = (uchar *)0x4;
  data_len._4_4_ = (uint)(open_type == 0);
  if (sftp->open_state == libssh2_NB_state_idle) {
    sftp->last_errno = 0;
    if (attrs_in != (LIBSSH2_SFTP_ATTRIBUTES *)0x0) {
      memcpy(&s,attrs_in,0x38);
    }
    if (data_len._4_4_ == 0) {
      local_cc = 0;
    }
    else {
      local_cc = sftp_attrsize((unsigned_long)s);
      local_cc = local_cc + 4;
    }
    sftp->open_packet_len = (int)filename_len + 0xd + local_cc;
    sftp->open_packet_sent = 0;
    rc = (ssize_t)(*session_00->alloc)((size_t)sftp->open_packet_len,&session_00->abstract);
    sftp->open_packet = (uchar *)rc;
    if (sftp->open_packet == (uchar *)0x0) {
      _libssh2_error(session_00,-6,"Unable to allocate memory for FXP_OPEN or FXP_OPENDIR packet");
      return (LIBSSH2_SFTP_HANDLE *)0x0;
    }
    iVar2 = 0x4000;
    if (data_len._4_4_ != 0) {
      iVar2 = 0x8000;
    }
    attrs.gid = mode | iVar2;
    _libssh2_store_u32((uchar **)&rc,sftp->open_packet_len - 4);
    uVar1 = 0xb;
    if (data_len._4_4_ != 0) {
      uVar1 = 3;
    }
    *(undefined1 *)rc = uVar1;
    uVar3 = sftp->request_id;
    sftp->request_id = uVar3 + 1;
    sftp->open_request_id = uVar3;
    rc = rc + 1;
    _libssh2_store_u32((uchar **)&rc,sftp->open_request_id);
    _libssh2_store_str((uchar **)&rc,filename,filename_len);
    if (data_len._4_4_ != 0) {
      _libssh2_store_u32((uchar **)&rc,flags);
      sVar4 = sftp_attr2bin((uchar *)rc,(LIBSSH2_SFTP_ATTRIBUTES *)&s);
      rc = sVar4 + rc;
    }
    sftp->open_state = libssh2_NB_state_created;
  }
  if (sftp->open_state == libssh2_NB_state_created) {
    lStack_a0 = _libssh2_channel_write
                          (channel_00,0,sftp->open_packet + sftp->open_packet_sent,
                           (ulong)sftp->open_packet_len - sftp->open_packet_sent);
    if (lStack_a0 == -0x25) {
      _libssh2_error(session_00,-0x25,"Would block sending FXP_OPEN or FXP_OPENDIR command");
      return (LIBSSH2_SFTP_HANDLE *)0x0;
    }
    if (lStack_a0 < 0) {
      _libssh2_error(session_00,(int)lStack_a0,"Unable to send FXP_OPEN*");
      (*session_00->free)(sftp->open_packet,&session_00->abstract);
      sftp->open_packet = (uchar *)0x0;
      sftp->open_state = libssh2_NB_state_idle;
      return (LIBSSH2_SFTP_HANDLE *)0x0;
    }
    sftp->open_packet_sent = lStack_a0 + sftp->open_packet_sent;
    if ((ulong)sftp->open_packet_len == sftp->open_packet_sent) {
      (*session_00->free)(sftp->open_packet,&session_00->abstract);
      sftp->open_packet = (uchar *)0x0;
      sftp->open_state = libssh2_NB_state_sent;
    }
  }
  if (sftp->open_state == libssh2_NB_state_sent) {
    data = (uchar *)0x0;
    iVar2 = sftp_packet_requirev
                      (sftp,2,"fe",sftp->open_request_id,&stack0xffffffffffffff48,(size_t *)&data,1)
    ;
    lStack_a0 = (long)iVar2;
    if (lStack_a0 == -0x25) {
      _libssh2_error(session_00,-0x25,"Would block waiting for status message");
      sftp_local = (LIBSSH2_SFTP *)0x0;
    }
    else if (lStack_a0 == -0x26) {
      if (data != (uchar *)0x0) {
        (*session_00->free)(puStack_b8,&session_00->abstract);
      }
      _libssh2_error(session_00,-0x1f,"Response too small");
      sftp_local = (LIBSSH2_SFTP *)0x0;
    }
    else {
      sftp->open_state = libssh2_NB_state_idle;
      if (lStack_a0 == 0) {
        if (*puStack_b8 == 'e') {
          bVar5 = true;
          if (data < (uchar *)0x9) {
            _libssh2_error(session_00,-0x1f,"Too small FXP_STATUS");
            (*session_00->free)(puStack_b8,&session_00->abstract);
            return (LIBSSH2_SFTP_HANDLE *)0x0;
          }
          uVar3 = _libssh2_ntohu32(puStack_b8 + 5);
          sftp->last_errno = uVar3;
          if (sftp->last_errno == 0) {
            (*session_00->free)(puStack_b8,&session_00->abstract);
            iVar2 = sftp_packet_require(sftp,'f',sftp->open_request_id,&stack0xffffffffffffff48,
                                        (size_t *)&data,10);
            lStack_a0 = (long)iVar2;
            if (lStack_a0 == -0x25) {
              sftp->open_state = libssh2_NB_state_sent;
              return (LIBSSH2_SFTP_HANDLE *)0x0;
            }
            if (lStack_a0 == -0x26) {
              if (data != (uchar *)0x0) {
                (*session_00->free)(puStack_b8,&session_00->abstract);
              }
              _libssh2_error(session_00,-0x1f,"Too small FXP_HANDLE");
              return (LIBSSH2_SFTP_HANDLE *)0x0;
            }
            bVar5 = lStack_a0 != 0;
          }
          if (bVar5) {
            _libssh2_error(session_00,-0x1f,"Failed opening remote file");
            (*session_00->free)(puStack_b8,&session_00->abstract);
            return (LIBSSH2_SFTP_HANDLE *)0x0;
          }
        }
        if (data < (uchar *)0xa) {
          _libssh2_error(session_00,-0x1f,"Too small FXP_HANDLE");
          (*session_00->free)(puStack_b8,&session_00->abstract);
          sftp_local = (LIBSSH2_SFTP *)0x0;
        }
        else {
          attrs.mtime = (unsigned_long)_libssh2_calloc(session_00,0x188);
          if ((void *)attrs.mtime == (void *)0x0) {
            _libssh2_error(session_00,-6,"Unable to allocate new SFTP handle structure");
            (*session_00->free)(puStack_b8,&session_00->abstract);
            sftp_local = (LIBSSH2_SFTP *)0x0;
          }
          else {
            *(uint *)(attrs.mtime + 0x128) = (uint)(data_len._4_4_ == 0);
            uVar3 = _libssh2_ntohu32(puStack_b8 + 5);
            *(ulong *)(attrs.mtime + 0x120) = (ulong)uVar3;
            if (0x100 < *(ulong *)(attrs.mtime + 0x120)) {
              *(undefined8 *)(attrs.mtime + 0x120) = 0x100;
            }
            if (data + -9 < *(uchar **)(attrs.mtime + 0x120)) {
              *(uchar **)(attrs.mtime + 0x120) = data + -9;
            }
            memcpy((void *)(attrs.mtime + 0x20),puStack_b8 + 9,*(size_t *)(attrs.mtime + 0x120));
            (*session_00->free)(puStack_b8,&session_00->abstract);
            _libssh2_list_add(&sftp->sftp_handles,(list_node *)attrs.mtime);
            *(LIBSSH2_SFTP **)(attrs.mtime + 0x18) = sftp;
            *(undefined8 *)(attrs.mtime + 0x130) = 0;
            *(undefined8 *)(attrs.mtime + 0x138) = 0;
            sftp_local = (LIBSSH2_SFTP *)attrs.mtime;
          }
        }
      }
      else {
        _libssh2_error(session_00,iVar2,"Timeout waiting for status message");
        sftp_local = (LIBSSH2_SFTP *)0x0;
      }
    }
  }
  else {
    sftp_local = (LIBSSH2_SFTP *)0x0;
  }
  return (LIBSSH2_SFTP_HANDLE *)sftp_local;
}

Assistant:

static LIBSSH2_SFTP_HANDLE *
sftp_open(LIBSSH2_SFTP *sftp, const char *filename,
          size_t filename_len, uint32_t flags, long mode,
          int open_type, LIBSSH2_SFTP_ATTRIBUTES *attrs_in)
{
    LIBSSH2_CHANNEL *channel = sftp->channel;
    LIBSSH2_SESSION *session = channel->session;
    LIBSSH2_SFTP_HANDLE *fp;
    LIBSSH2_SFTP_ATTRIBUTES attrs = {
        LIBSSH2_SFTP_ATTR_PERMISSIONS, 0, 0, 0, 0, 0, 0
    };
    unsigned char *s;
    ssize_t rc;
    int open_file = (open_type == LIBSSH2_SFTP_OPENFILE) ? 1 : 0;

    if(sftp->open_state == libssh2_NB_state_idle) {
        sftp->last_errno = LIBSSH2_FX_OK;

        if(attrs_in) {
            memcpy(&attrs, attrs_in, sizeof(LIBSSH2_SFTP_ATTRIBUTES));
        }

        /* packet_len(4) + packet_type(1) + request_id(4) + filename_len(4) +
           flags(4) */
        sftp->open_packet_len = (uint32_t)(filename_len + 13 +
            (open_file? (4 + sftp_attrsize(attrs.flags)) : 0));

        /* surprise! this starts out with nothing sent */
        sftp->open_packet_sent = 0;
        s = sftp->open_packet = LIBSSH2_ALLOC(session, sftp->open_packet_len);
        if(!sftp->open_packet) {
            _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                           "Unable to allocate memory for FXP_OPEN or "
                           "FXP_OPENDIR packet");
            return NULL;
        }
        /* Filetype in SFTP 3 and earlier */
        attrs.permissions = mode |
            (open_file ? LIBSSH2_SFTP_ATTR_PFILETYPE_FILE :
             LIBSSH2_SFTP_ATTR_PFILETYPE_DIR);

        _libssh2_store_u32(&s, sftp->open_packet_len - 4);
        *(s++) = open_file? SSH_FXP_OPEN : SSH_FXP_OPENDIR;
        sftp->open_request_id = sftp->request_id++;
        _libssh2_store_u32(&s, sftp->open_request_id);
        _libssh2_store_str(&s, filename, filename_len);

        if(open_file) {
            _libssh2_store_u32(&s, flags);
            s += sftp_attr2bin(s, &attrs);
        }

        _libssh2_debug((session, LIBSSH2_TRACE_SFTP, "Sending %s open request",
                       open_file? "file" : "directory"));

        sftp->open_state = libssh2_NB_state_created;
    }

    if(sftp->open_state == libssh2_NB_state_created) {
        rc = _libssh2_channel_write(channel, 0, sftp->open_packet+
                                    sftp->open_packet_sent,
                                    sftp->open_packet_len -
                                    sftp->open_packet_sent);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block sending FXP_OPEN or "
                           "FXP_OPENDIR command");
            return NULL;
        }
        else if(rc < 0) {
            _libssh2_error(session, (int)rc, "Unable to send FXP_OPEN*");
            LIBSSH2_FREE(session, sftp->open_packet);
            sftp->open_packet = NULL;
            sftp->open_state = libssh2_NB_state_idle;
            return NULL;
        }

        /* bump the sent counter and remain in this state until the whole
           data is off */
        sftp->open_packet_sent += rc;

        if(sftp->open_packet_len == sftp->open_packet_sent) {
            LIBSSH2_FREE(session, sftp->open_packet);
            sftp->open_packet = NULL;

            sftp->open_state = libssh2_NB_state_sent;
        }
    }

    if(sftp->open_state == libssh2_NB_state_sent) {
        size_t data_len = 0;
        unsigned char *data;
        static const unsigned char fopen_responses[2] =
            { SSH_FXP_HANDLE, SSH_FXP_STATUS };
        rc = sftp_packet_requirev(sftp, 2, fopen_responses,
                                  sftp->open_request_id, &data,
                                  &data_len, 1);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block waiting for status message");
            return NULL;
        }
        else if(rc == LIBSSH2_ERROR_BUFFER_TOO_SMALL) {
            if(data_len > 0) {
                LIBSSH2_FREE(session, data);
            }
            _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                           "Response too small");
            return NULL;
        }
        sftp->open_state = libssh2_NB_state_idle;
        if(rc) {
            _libssh2_error(session, (int)rc,
                           "Timeout waiting for status message");
            return NULL;
        }

        /* OPEN can basically get STATUS or HANDLE back, where HANDLE implies
           a fine response while STATUS means error. It seems though that at
           times we get an SSH_FX_OK back in a STATUS, followed the "real"
           HANDLE so we need to properly deal with that. */
        if(data[0] == SSH_FXP_STATUS) {
            int badness = 1;

            if(data_len < 9) {
                _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                               "Too small FXP_STATUS");
                LIBSSH2_FREE(session, data);
                return NULL;
            }

            sftp->last_errno = _libssh2_ntohu32(data + 5);

            if(LIBSSH2_FX_OK == sftp->last_errno) {
                _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                               "got HANDLE FXOK"));

                LIBSSH2_FREE(session, data);

                /* silly situation, but check for a HANDLE */
                rc = sftp_packet_require(sftp, SSH_FXP_HANDLE,
                                         sftp->open_request_id, &data,
                                         &data_len, 10);
                if(rc == LIBSSH2_ERROR_EAGAIN) {
                    /* go back to sent state and wait for something else */
                    sftp->open_state = libssh2_NB_state_sent;
                    return NULL;
                }
                else if(rc == LIBSSH2_ERROR_BUFFER_TOO_SMALL) {
                    if(data_len > 0) {
                        LIBSSH2_FREE(session, data);
                    }
                    _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                   "Too small FXP_HANDLE");
                    return NULL;
                }
                else if(!rc)
                    /* we got the handle so this is not a bad situation */
                    badness = 0;
            }

            if(badness) {
                _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                               "Failed opening remote file");
                _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                               "got FXP_STATUS %d",
                               sftp->last_errno));
                LIBSSH2_FREE(session, data);
                return NULL;
            }
        }

        if(data_len < 10) {
            _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                           "Too small FXP_HANDLE");
            LIBSSH2_FREE(session, data);
            return NULL;
        }

        fp = LIBSSH2_CALLOC(session, sizeof(LIBSSH2_SFTP_HANDLE));
        if(!fp) {
            _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                           "Unable to allocate new SFTP handle structure");
            LIBSSH2_FREE(session, data);
            return NULL;
        }
        fp->handle_type = open_file ? LIBSSH2_SFTP_HANDLE_FILE :
            LIBSSH2_SFTP_HANDLE_DIR;

        fp->handle_len = _libssh2_ntohu32(data + 5);
        if(fp->handle_len > SFTP_HANDLE_MAXLEN)
            /* SFTP doesn't allow handles longer than 256 characters */
            fp->handle_len = SFTP_HANDLE_MAXLEN;

        if(fp->handle_len > (data_len - 9))
            /* do not reach beyond the end of the data we got */
            fp->handle_len = data_len - 9;

        memcpy(fp->handle, data + 9, fp->handle_len);

        LIBSSH2_FREE(session, data);

        /* add this file handle to the list kept in the sftp session */
        _libssh2_list_add(&sftp->sftp_handles, &fp->node);

        fp->sftp = sftp; /* point to the parent struct */

        fp->u.file.offset = 0;
        fp->u.file.offset_sent = 0;

        _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                       "Open command successful"));
        return fp;
    }
    return NULL;
}